

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O0

void __thiscall
qclab::qgates::iSWAP<std::complex<float>_>::apply
          (iSWAP<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  int qubit;
  int target;
  int64_t iVar1;
  const_reference pvVar2;
  int local_80;
  int local_7c;
  int qnew [2];
  CNOT<std::complex<float>_> CNOT;
  undefined1 local_50 [8];
  Hadamard<std::complex<float>_> H;
  Phase90<std::complex<float>_> S;
  int qubit1;
  int qubit0;
  int offset_local;
  SquareMatrix<std::complex<float>_> *matrix_local;
  int nbQubits_local;
  Op op_local;
  Side side_local;
  iSWAP<std::complex<float>_> *this_local;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/iSWAP.cpp"
                  ,0x25,
                  "virtual void qclab::qgates::iSWAP<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  iVar1 = dense::SquareMatrix<std::complex<float>_>::size(matrix);
  if (iVar1 != 1 << ((byte)nbQubits & 0x1f)) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/iSWAP.cpp"
                  ,0x26,
                  "virtual void qclab::qgates::iSWAP<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  pvVar2 = std::array<int,_2UL>::operator[](&this->qubits_,0);
  qubit = *pvVar2 + offset;
  pvVar2 = std::array<int,_2UL>::operator[](&this->qubits_,1);
  target = *pvVar2 + offset;
  if (nbQubits <= qubit) {
    __assert_fail("qubit0 < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/iSWAP.cpp"
                  ,0x29,
                  "virtual void qclab::qgates::iSWAP<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  if (target < nbQubits) {
    Phase90<std::complex<float>_>::Phase90
              ((Phase90<std::complex<float>_> *)&H.super_QGate1<std::complex<float>_>.qubit_,qubit);
    Hadamard<std::complex<float>_>::Hadamard((Hadamard<std::complex<float>_> *)local_50,qubit);
    CX<std::complex<float>_>::CX((CX<std::complex<float>_> *)qnew,qubit,target,1);
    Phase90<std::complex<float>_>::apply
              ((Phase90<std::complex<float>_> *)&H.super_QGate1<std::complex<float>_>.qubit_,side,op
               ,nbQubits,matrix,0);
    QGate1<std::complex<float>_>::setQubit
              ((QGate1<std::complex<float>_> *)&H.super_QGate1<std::complex<float>_>.qubit_,target);
    Phase90<std::complex<float>_>::apply
              ((Phase90<std::complex<float>_> *)&H.super_QGate1<std::complex<float>_>.qubit_,side,op
               ,nbQubits,matrix,0);
    Hadamard<std::complex<float>_>::apply
              ((Hadamard<std::complex<float>_> *)local_50,side,op,nbQubits,matrix,0);
    CX<std::complex<float>_>::apply((CX<std::complex<float>_> *)qnew,side,op,nbQubits,matrix,0);
    local_80 = target;
    local_7c = qubit;
    QControlledGate2<std::complex<float>_>::setQubits
              ((QControlledGate2<std::complex<float>_> *)qnew,&local_80);
    CX<std::complex<float>_>::apply((CX<std::complex<float>_> *)qnew,side,op,nbQubits,matrix,0);
    QGate1<std::complex<float>_>::setQubit((QGate1<std::complex<float>_> *)local_50,target);
    Hadamard<std::complex<float>_>::apply
              ((Hadamard<std::complex<float>_> *)local_50,side,op,nbQubits,matrix,0);
    CX<std::complex<float>_>::~CX((CX<std::complex<float>_> *)qnew);
    Hadamard<std::complex<float>_>::~Hadamard((Hadamard<std::complex<float>_> *)local_50);
    Phase90<std::complex<float>_>::~Phase90
              ((Phase90<std::complex<float>_> *)&H.super_QGate1<std::complex<float>_>.qubit_);
    return;
  }
  __assert_fail("qubit1 < nbQubits",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/iSWAP.cpp"
                ,0x29,
                "virtual void qclab::qgates::iSWAP<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
               );
}

Assistant:

void iSWAP< T >::apply( Side side , Op op , const int nbQubits ,
                          qclab::dense::SquareMatrix< T >& matrix ,
                          const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit0 = qubits_[0] + offset ;
    const int qubit1 = qubits_[1] + offset ;
    assert( qubit0 < nbQubits ) ; assert( qubit1 < nbQubits ) ;
    //
    // -/-----\-   -[S]-[H]--*--[X]-----   -----[X]--*--[H]-[S]-
    //  |iSWAP|  =           |   |       =       |   |
    // -\-----/-   -[S]-----[X]--*--[H]-   -[H]--*--[X]-----[S]-
    //
    qclab::qgates::Phase90< T >  S( qubit0 ) ;
    qclab::qgates::Hadamard< T > H( qubit0 ) ;
    qclab::qgates::CNOT< T >     CNOT( qubit0 , qubit1 ) ;
    // layer 1
    S.apply( side , op , nbQubits , matrix ) ;
    S.setQubit( qubit1 ) ;
    S.apply( side , op , nbQubits , matrix ) ;
    // layer 2
    H.apply( side , op , nbQubits , matrix ) ;
    // layer 3
    CNOT.apply( side , op , nbQubits , matrix ) ;
    // layer 4
    int qnew[] = { qubit1 , qubit0 } ;
    CNOT.setQubits( &qnew[0] ) ;
    CNOT.apply( side , op , nbQubits , matrix ) ;
    // layer 5
    H.setQubit( qubit1 ) ;
    H.apply( side , op , nbQubits , matrix ) ;
  }